

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focus_attack_strategy.cpp
# Opt level: O1

void __thiscall
FocusAttackStrategy::generateActions(FocusAttackStrategy *this,PlayerSight *sight,Actions *actions)

{
  Vec2 pos;
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int *piVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int local_5c;
  
  if ((this->super_Strategy).disabled == false) {
    piVar5 = *(int **)&sight->unitInSight;
    piVar3 = *(int **)&sight->field_0x80;
    if (piVar5 == piVar3) {
      local_5c = -1;
      bVar4 = false;
    }
    else {
      local_5c = -1;
      fVar9 = 1e+08;
      bVar4 = false;
      do {
        iVar1 = *piVar5;
        iVar2 = this->target;
        if (iVar1 == iVar2) {
          bVar4 = true;
        }
        else {
          fVar8 = (float)piVar5[1];
          fVar10 = (float)piVar5[2];
          fVar6 = fVar8 - (sight->pos).x;
          fVar7 = fVar10 - (sight->pos).y;
          fVar6 = fVar6 * fVar6 + fVar7 * fVar7;
          if (fVar6 < 0.0) {
            fVar6 = sqrtf(fVar6);
          }
          else {
            fVar6 = SQRT(fVar6);
          }
          if (fVar6 < fVar9) {
            fVar8 = fVar8 - (sight->pos).x;
            fVar10 = fVar10 - (sight->pos).y;
            fVar9 = fVar8 * fVar8 + fVar10 * fVar10;
            local_5c = iVar1;
            if (fVar9 < 0.0) {
              fVar9 = sqrtf(fVar9);
            }
            else {
              fVar9 = SQRT(fVar9);
            }
          }
        }
      } while ((iVar1 != iVar2) && (piVar5 = piVar5 + 5, piVar5 != piVar3));
    }
    if (!bVar4) {
      this->target = local_5c;
    }
    if (this->target != -1) {
      piVar3 = *(int **)&sight->field_0x80;
      for (piVar5 = *(int **)&sight->unitInSight; piVar5 != piVar3; piVar5 = piVar5 + 5) {
        if (*piVar5 == this->target) {
          pos = *(Vec2 *)(piVar5 + 1);
          if (sight->canSuckAttack == true) {
            fVar9 = pos.x - (sight->pos).x;
            fVar8 = pos.y - (sight->pos).y;
            fVar9 = fVar9 * fVar9 + fVar8 * fVar8;
            if (fVar9 < 0.0) {
              fVar9 = sqrtf(fVar9);
            }
            else {
              fVar9 = SQRT(fVar9);
            }
            if (fVar9 <= 4.0) {
              Actions::emplace(actions,SuckAttack,this->target,pos);
            }
          }
          if (sight->canUseBomb == true) {
            if (sight->bombCount == 0) {
              Actions::emplace(actions,BuyItem,0,(Vec2)0x0);
            }
            Actions::emplace(actions,UseItem,0,pos);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FocusAttackStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    bool found = false;
    float dist = FINF;
    int nearest = -1;
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id == target)
        {
            found = true;
            break;
        }
        if ((uinfo.pos - sight.pos).length() < dist)
        {
            dist = (uinfo.pos - sight.pos).length();
            nearest = uinfo.id;
        }
    }
    if (!found)
        target = nearest;
    if (target == -1)
        return;
    
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id != target)
            continue;
        if (sight.canSuckAttack && (uinfo.pos - sight.pos).length() <= SuckRange)
            actions->emplace(SuckAttack, target, uinfo.pos);
        if (sight.canUseBomb)
        {
            if (sight.bombCount == 0)
                actions->emplace(BuyItem, BombItem, Vec2());
            actions->emplace(UseItem, BombItem, uinfo.pos);
        }
    }
}